

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internals.h
# Opt level: O0

internals * pybind11::detail::get_internals(void)

{
  _ts *p_Var1;
  bool bVar2;
  int iVar3;
  PyObject *pPVar4;
  internals **ppiVar5;
  internals *this;
  unsigned_long uVar6;
  PyTypeObject *pPVar7;
  bool local_fa;
  _lambda_std____exception_ptr__exception_ptr__1_ local_e9;
  _func_void_exception_ptr *local_e8;
  item_accessor local_e0;
  capsule local_c0;
  long local_b8;
  PyThreadState *tstate;
  internals **internals_ptr;
  object local_88;
  capsule local_80;
  byte local_72;
  byte local_71;
  item_accessor local_70;
  handle local_50;
  PyObject *local_48;
  handle local_30;
  handle builtins;
  char *id;
  internals ***pppiStack_18;
  gil_scoped_acquire_local gil;
  internals ***internals_pp;
  
  pppiStack_18 = get_internals_pp();
  if ((*pppiStack_18 == (internals **)0x0) || (**pppiStack_18 == (internals *)0x0)) {
    get_internals::gil_scoped_acquire_local::gil_scoped_acquire_local
              ((gil_scoped_acquire_local *)((long)&id + 4));
    builtins.m_ptr = (PyObject *)anon_var_dwarf_271a8;
    pPVar4 = (PyObject *)PyEval_GetBuiltins();
    handle::handle(&local_30,pPVar4);
    local_71 = 0;
    local_72 = 0;
    bVar2 = object_api<pybind11::handle>::contains<char_const*const&>
                      ((object_api<pybind11::handle> *)&local_30,(char **)&builtins);
    local_fa = false;
    if (bVar2) {
      object_api<pybind11::handle>::operator[]
                (&local_70,(object_api<pybind11::handle> *)&local_30,"__pybind11_internals_v3__");
      local_71 = 1;
      accessor::operator_cast_to_object((accessor *)&local_50);
      local_72 = 1;
      local_48 = local_50.m_ptr;
      local_fa = isinstance<pybind11::capsule,_0>(local_50);
    }
    if ((local_72 & 1) != 0) {
      object::~object((object *)&local_50);
    }
    if ((local_71 & 1) != 0) {
      accessor<pybind11::detail::accessor_policies::generic_item>::~accessor(&local_70);
    }
    if (local_fa == false) {
      if (*pppiStack_18 == (internals **)0x0) {
        ppiVar5 = (internals **)operator_new(8);
        *ppiVar5 = (internals *)0x0;
        *pppiStack_18 = ppiVar5;
      }
      tstate = (PyThreadState *)*pppiStack_18;
      this = (internals *)operator_new(0x1d8);
      memset(this,0,0x1d8);
      internals::internals(this);
      tstate->prev = (_ts *)this;
      PyEval_InitThreads();
      local_b8 = PyThreadState_Get();
      uVar6 = PyThread_tss_alloc();
      tstate->prev[1].thread_id = uVar6;
      if ((tstate->prev[1].thread_id == 0) ||
         (iVar3 = PyThread_tss_create(tstate->prev[1].thread_id), iVar3 != 0)) {
        pybind11_fail("get_internals: could not successfully initialize the TSS key!");
      }
      PyThread_tss_set(tstate->prev[1].thread_id,local_b8);
      *(undefined8 *)&tstate->prev[1].trash_delete_nesting = *(undefined8 *)(local_b8 + 0x10);
      capsule::capsule(&local_c0,*pppiStack_18,(char *)0x0,(_func_void_PyObject_ptr *)0x0);
      object_api<pybind11::handle>::operator[]
                (&local_e0,(object_api<pybind11::handle> *)&local_30,"__pybind11_internals_v3__");
      accessor<pybind11::detail::accessor_policies::generic_item>::operator=(&local_e0,&local_c0);
      accessor<pybind11::detail::accessor_policies::generic_item>::~accessor(&local_e0);
      capsule::~capsule(&local_c0);
      p_Var1 = tstate->prev;
      local_e8 = get_internals()::{lambda(std::__exception_ptr::exception_ptr)#1}::
                 operator_cast_to_function_pointer(&local_e9);
      std::
      forward_list<void_(*)(std::__exception_ptr::exception_ptr),_std::allocator<void_(*)(std::__exception_ptr::exception_ptr)>_>
      ::push_front((forward_list<void_(*)(std::__exception_ptr::exception_ptr),_std::allocator<void_(*)(std::__exception_ptr::exception_ptr)>_>
                    *)&p_Var1[1].c_profilefunc,&local_e8);
      pPVar7 = make_static_property_type();
      tstate->prev[1].dict = (PyObject *)pPVar7;
      pPVar7 = make_default_metaclass();
      *(PyTypeObject **)&tstate->prev[1].gilstate_counter = pPVar7;
      pPVar4 = make_object_base_type(*(PyTypeObject **)&tstate->prev[1].gilstate_counter);
      tstate->prev[1].async_exc = pPVar4;
    }
    else {
      object_api<pybind11::handle>::operator[]
                ((item_accessor *)&internals_ptr,(object_api<pybind11::handle> *)&local_30,
                 "__pybind11_internals_v3__");
      accessor::operator_cast_to_object((accessor *)&local_88);
      capsule::capsule(&local_80,&local_88);
      ppiVar5 = capsule::operator_cast_to_internals__(&local_80);
      *pppiStack_18 = ppiVar5;
      capsule::~capsule(&local_80);
      object::~object(&local_88);
      accessor<pybind11::detail::accessor_policies::generic_item>::~accessor
                ((accessor<pybind11::detail::accessor_policies::generic_item> *)&internals_ptr);
    }
    internals_pp = (internals ***)**pppiStack_18;
    get_internals::gil_scoped_acquire_local::~gil_scoped_acquire_local
              ((gil_scoped_acquire_local *)((long)&id + 4));
  }
  else {
    internals_pp = (internals ***)**pppiStack_18;
  }
  return (internals *)internals_pp;
}

Assistant:

PYBIND11_NOINLINE inline internals &get_internals() {
    auto **&internals_pp = get_internals_pp();
    if (internals_pp && *internals_pp)
        return **internals_pp;

    // Ensure that the GIL is held since we will need to make Python calls.
    // Cannot use py::gil_scoped_acquire here since that constructor calls get_internals.
    struct gil_scoped_acquire_local {
        gil_scoped_acquire_local() : state (PyGILState_Ensure()) {}
        ~gil_scoped_acquire_local() { PyGILState_Release(state); }
        const PyGILState_STATE state;
    } gil;

    constexpr auto *id = PYBIND11_INTERNALS_ID;
    auto builtins = handle(PyEval_GetBuiltins());
    if (builtins.contains(id) && isinstance<capsule>(builtins[id])) {
        internals_pp = static_cast<internals **>(capsule(builtins[id]));

        // We loaded builtins through python's builtins, which means that our `error_already_set`
        // and `builtin_exception` may be different local classes than the ones set up in the
        // initial exception translator, below, so add another for our local exception classes.
        //
        // libstdc++ doesn't require this (types there are identified only by name)
#if !defined(__GLIBCXX__)
        (*internals_pp)->registered_exception_translators.push_front(
            [](std::exception_ptr p) -> void {
                try {
                    if (p) std::rethrow_exception(p);
                } catch (error_already_set &e)       { e.restore();   return;
                } catch (const builtin_exception &e) { e.set_error(); return;
                }
            }
        );
#endif
    } else {
        if (!internals_pp) internals_pp = new internals*();
        auto *&internals_ptr = *internals_pp;
        internals_ptr = new internals();
#if defined(WITH_THREAD)
        PyEval_InitThreads();
        PyThreadState *tstate = PyThreadState_Get();
        #if PY_VERSION_HEX >= 0x03070000
            internals_ptr->tstate = PyThread_tss_alloc();
            if (!internals_ptr->tstate || PyThread_tss_create(internals_ptr->tstate))
                pybind11_fail("get_internals: could not successfully initialize the TSS key!");
            PyThread_tss_set(internals_ptr->tstate, tstate);
        #else
            internals_ptr->tstate = PyThread_create_key();
            if (internals_ptr->tstate == -1)
                pybind11_fail("get_internals: could not successfully initialize the TLS key!");
            PyThread_set_key_value(internals_ptr->tstate, tstate);
        #endif
        internals_ptr->istate = tstate->interp;
#endif
        builtins[id] = capsule(internals_pp);
        internals_ptr->registered_exception_translators.push_front(
            [](std::exception_ptr p) -> void {
                try {
                    if (p) std::rethrow_exception(p);
                } catch (error_already_set &e)           { e.restore();                                    return;
                } catch (const builtin_exception &e)     { e.set_error();                                  return;
                } catch (const std::bad_alloc &e)        { PyErr_SetString(PyExc_MemoryError,   e.what()); return;
                } catch (const std::domain_error &e)     { PyErr_SetString(PyExc_ValueError,    e.what()); return;
                } catch (const std::invalid_argument &e) { PyErr_SetString(PyExc_ValueError,    e.what()); return;
                } catch (const std::length_error &e)     { PyErr_SetString(PyExc_ValueError,    e.what()); return;
                } catch (const std::out_of_range &e)     { PyErr_SetString(PyExc_IndexError,    e.what()); return;
                } catch (const std::range_error &e)      { PyErr_SetString(PyExc_ValueError,    e.what()); return;
                } catch (const std::exception &e)        { PyErr_SetString(PyExc_RuntimeError,  e.what()); return;
                } catch (...) {
                    PyErr_SetString(PyExc_RuntimeError, "Caught an unknown exception!");
                    return;
                }
            }
        );
        internals_ptr->static_property_type = make_static_property_type();
        internals_ptr->default_metaclass = make_default_metaclass();
        internals_ptr->instance_base = make_object_base_type(internals_ptr->default_metaclass);
    }
    return **internals_pp;
}